

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_solver.cpp
# Opt level: O3

void test_1(string *out_dir)

{
  double *pdVar1;
  Index *pIVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  Index IVar12;
  variable_if_dynamic<long,__1> vVar13;
  ChStreamOutAscii *pCVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  Index index;
  ulong uVar18;
  Index *pIVar19;
  long lVar20;
  Index size;
  Matrix<double,__1,__1,_1,__1,__1> *pMVar21;
  ActualDstType actualDst;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  string filename;
  double max_LCPerr;
  double max_res;
  ChSystemDescriptor mdescriptor;
  ChVariablesGeneric mvarA;
  Matrix<double,__1,__1,_1,__1,__1> local_948;
  Matrix<double,__1,__1,_1,__1,__1> local_930;
  ChVariablesGeneric mvarB;
  Matrix<double,__1,__1,_1,__1,__1> local_8d8;
  Matrix<double,__1,__1,_1,__1,__1> local_8c0;
  ChSparseMatrix matrCq;
  ChSparseMatrix matrM;
  ChConstraintTwoGeneric mcb;
  double local_7f8;
  double local_7f0;
  ChConstraintTwoGeneric mca;
  double local_760;
  double local_758;
  ChStreamOutAsciiFile fileM;
  long local_6c0;
  ChStreamOutAscii local_400 [32];
  ChSolverPSOR solver;
  ChStreamOutAsciiFile fileCq;
  long local_310 [88];
  ChStreamOutAscii local_50 [32];
  
  pCVar14 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar14,"\n-------------------------------------------------\n");
  pCVar14 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar14,"TEST: generic system with two constraints \n\n");
  chrono::ChSystemDescriptor::ChSystemDescriptor(&mdescriptor);
  chrono::ChVariablesGeneric::ChVariablesGeneric(&mvarA,3);
  IVar12 = local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_cols;
  _fileM = local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows;
  if ((local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols |
      local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows) <
      0) {
LAB_0010f4fa:
    pcVar17 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_identity_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
    ;
    goto LAB_0010f599;
  }
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
            (&local_948,
             (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
              *)&fileM,(assign_op<double,_double> *)&fileCq);
  if (-1 < (local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
            m_cols | local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                     m_storage.m_rows)) {
    uVar15 = local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_cols * local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_rows;
    uVar18 = uVar15 + 7;
    if (-1 < (long)uVar15) {
      uVar18 = uVar15;
    }
    uVar18 = uVar18 & 0xfffffffffffffff8;
    if (7 < (long)uVar15) {
      auVar22 = vbroadcastsd_avx512f(ZEXT816(0x4024000000000000));
      lVar20 = 0;
      do {
        auVar23 = vmulpd_avx512f(auVar22,*(undefined1 (*) [64])
                                          (local_948.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                           .m_storage.m_data + lVar20));
        *(undefined1 (*) [64])
         (local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_data + lVar20) = auVar23;
        lVar20 = lVar20 + 8;
      } while (lVar20 < (long)uVar18);
    }
    if ((long)uVar15 % 8 != 0 && (long)uVar18 <= (long)uVar15) {
      auVar22 = vbroadcastsd_avx512f(ZEXT816(0x4024000000000000));
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar24 = vpbroadcastq_avx512f();
      uVar16 = 0;
      do {
        auVar25 = vpbroadcastq_avx512f();
        auVar25 = vporq_avx512f(auVar25,auVar23);
        uVar11 = vpcmpuq_avx512f(auVar25,auVar24,2);
        pdVar1 = local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_data + uVar18 + uVar16;
        auVar25._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * (long)pdVar1[1];
        auVar25._0_8_ = (ulong)((byte)uVar11 & 1) * (long)*pdVar1;
        auVar25._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * (long)pdVar1[2];
        auVar25._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * (long)pdVar1[3];
        auVar25._32_8_ = (ulong)((byte)(uVar11 >> 4) & 1) * (long)pdVar1[4];
        auVar25._40_8_ = (ulong)((byte)(uVar11 >> 5) & 1) * (long)pdVar1[5];
        auVar25._48_8_ = (ulong)((byte)(uVar11 >> 6) & 1) * (long)pdVar1[6];
        auVar25._56_8_ = (uVar11 >> 7) * (long)pdVar1[7];
        auVar25 = vmulpd_avx512f(auVar25,auVar22);
        pdVar1 = local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_data + uVar18 + uVar16;
        bVar4 = (bool)((byte)uVar11 & 1);
        bVar5 = (bool)((byte)(uVar11 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar11 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar11 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar11 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar11 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar11 >> 6) & 1);
        *pdVar1 = (double)((ulong)bVar4 * auVar25._0_8_ | (ulong)!bVar4 * (long)*pdVar1);
        pdVar1[1] = (double)((ulong)bVar5 * auVar25._8_8_ | (ulong)!bVar5 * (long)pdVar1[1]);
        pdVar1[2] = (double)((ulong)bVar6 * auVar25._16_8_ | (ulong)!bVar6 * (long)pdVar1[2]);
        pdVar1[3] = (double)((ulong)bVar7 * auVar25._24_8_ | (ulong)!bVar7 * (long)pdVar1[3]);
        pdVar1[4] = (double)((ulong)bVar8 * auVar25._32_8_ | (ulong)!bVar8 * (long)pdVar1[4]);
        pdVar1[5] = (double)((ulong)bVar9 * auVar25._40_8_ | (ulong)!bVar9 * (long)pdVar1[5]);
        pdVar1[6] = (double)((ulong)bVar10 * auVar25._48_8_ | (ulong)!bVar10 * (long)pdVar1[6]);
        pdVar1[7] = (double)((uVar11 >> 7) * auVar25._56_8_ |
                            (ulong)!SUB81(uVar11 >> 7,0) * (long)pdVar1[7]);
        uVar16 = uVar16 + 8;
      } while (((long)uVar15 % 8 + 7U & 0xfffffffffffffff8) != uVar16);
    }
    if (local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows
        != local_948.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_cols) {
LAB_0010f52b:
      __assert_fail("rows() == cols()","/usr/include/eigen3/Eigen/src/LU/InverseImpl.h",0x15f,
                    "const Inverse<Derived> Eigen::MatrixBase<Eigen::Matrix<double, -1, -1, 1>>::inverse() const [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                   );
    }
    _fileM = (long)&local_948;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_Eigen::Inverse<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_930,(SrcXprType *)&fileM,(assign_op<double,_double> *)&fileCq);
    chrono::ChVariables::Get_fb((ChVectorRef *)&fileM,(ChVariables *)&mvarA);
    if (0 < IVar12) {
      *(undefined8 *)_fileM = 0x3ff0000000000000;
      chrono::ChVariables::Get_fb((ChVectorRef *)&fileM,(ChVariables *)&mvarA);
      if (1 < IVar12) {
        *(Index *)(_fileM + 8) = 0x4000000000000000;
        chrono::ChVariablesGeneric::ChVariablesGeneric(&mvarB,3);
        IVar12 = local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_cols;
        _fileM = local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_rows;
        if ((local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
             m_cols | local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_rows) < 0) goto LAB_0010f4fa;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::internal::assign_op<double,double>>
                  (&local_8d8,
                   (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                    *)&fileM,(assign_op<double,_double> *)&fileCq);
        if (-1 < (local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols |
                 local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_rows)) {
          uVar15 = local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_cols *
                   local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                   m_storage.m_rows;
          uVar18 = uVar15 + 7;
          if (-1 < (long)uVar15) {
            uVar18 = uVar15;
          }
          uVar18 = uVar18 & 0xfffffffffffffff8;
          if (7 < (long)uVar15) {
            auVar22 = vbroadcastsd_avx512f(ZEXT816(0x4034000000000000));
            lVar20 = 0;
            do {
              auVar23 = vmulpd_avx512f(auVar22,*(undefined1 (*) [64])
                                                (local_8d8.
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                 .m_storage.m_data + lVar20));
              *(undefined1 (*) [64])
               (local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
                .m_data + lVar20) = auVar23;
              lVar20 = lVar20 + 8;
            } while (lVar20 < (long)uVar18);
          }
          if ((long)uVar15 % 8 != 0 && (long)uVar18 <= (long)uVar15) {
            auVar22 = vbroadcastsd_avx512f(ZEXT816(0x4034000000000000));
            auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar24 = vpbroadcastq_avx512f();
            uVar16 = 0;
            do {
              auVar25 = vpbroadcastq_avx512f();
              auVar25 = vporq_avx512f(auVar25,auVar23);
              uVar11 = vpcmpuq_avx512f(auVar25,auVar24,2);
              pdVar1 = local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                       m_storage.m_data + uVar18 + uVar16;
              auVar26._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * (long)pdVar1[1];
              auVar26._0_8_ = (ulong)((byte)uVar11 & 1) * (long)*pdVar1;
              auVar26._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * (long)pdVar1[2];
              auVar26._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * (long)pdVar1[3];
              auVar26._32_8_ = (ulong)((byte)(uVar11 >> 4) & 1) * (long)pdVar1[4];
              auVar26._40_8_ = (ulong)((byte)(uVar11 >> 5) & 1) * (long)pdVar1[5];
              auVar26._48_8_ = (ulong)((byte)(uVar11 >> 6) & 1) * (long)pdVar1[6];
              auVar26._56_8_ = (uVar11 >> 7) * (long)pdVar1[7];
              auVar25 = vmulpd_avx512f(auVar26,auVar22);
              pdVar1 = local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                       m_storage.m_data + uVar18 + uVar16;
              bVar4 = (bool)((byte)uVar11 & 1);
              bVar5 = (bool)((byte)(uVar11 >> 1) & 1);
              bVar6 = (bool)((byte)(uVar11 >> 2) & 1);
              bVar7 = (bool)((byte)(uVar11 >> 3) & 1);
              bVar8 = (bool)((byte)(uVar11 >> 4) & 1);
              bVar9 = (bool)((byte)(uVar11 >> 5) & 1);
              bVar10 = (bool)((byte)(uVar11 >> 6) & 1);
              *pdVar1 = (double)((ulong)bVar4 * auVar25._0_8_ | (ulong)!bVar4 * (long)*pdVar1);
              pdVar1[1] = (double)((ulong)bVar5 * auVar25._8_8_ | (ulong)!bVar5 * (long)pdVar1[1]);
              pdVar1[2] = (double)((ulong)bVar6 * auVar25._16_8_ | (ulong)!bVar6 * (long)pdVar1[2]);
              pdVar1[3] = (double)((ulong)bVar7 * auVar25._24_8_ | (ulong)!bVar7 * (long)pdVar1[3]);
              pdVar1[4] = (double)((ulong)bVar8 * auVar25._32_8_ | (ulong)!bVar8 * (long)pdVar1[4]);
              pdVar1[5] = (double)((ulong)bVar9 * auVar25._40_8_ | (ulong)!bVar9 * (long)pdVar1[5]);
              pdVar1[6] = (double)((ulong)bVar10 * auVar25._48_8_ | (ulong)!bVar10 * (long)pdVar1[6]
                                  );
              pdVar1[7] = (double)((uVar11 >> 7) * auVar25._56_8_ |
                                  (ulong)!SUB81(uVar11 >> 7,0) * (long)pdVar1[7]);
              uVar16 = uVar16 + 8;
            } while (((long)uVar15 % 8 + 7U & 0xfffffffffffffff8) != uVar16);
          }
          if (local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
              m_rows != local_8d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                        m_storage.m_cols) goto LAB_0010f52b;
          _fileM = (long)&local_8d8;
          Eigen::internal::
          Assignment<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_Eigen::Inverse<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
          ::run(&local_8c0,(SrcXprType *)&fileM,(assign_op<double,_double> *)&fileCq);
          chrono::ChSystemDescriptor::InsertVariables(&mdescriptor,(ChVariables *)&mvarA);
          chrono::ChSystemDescriptor::InsertVariables(&mdescriptor,(ChVariables *)&mvarB);
          chrono::ChConstraintTwoGeneric::ChConstraintTwoGeneric
                    (&mca,(ChVariables *)&mvarA,(ChVariables *)&mvarB);
          chrono::ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&fileM,&mca);
          if (0 < local_6c0) {
            *(undefined8 *)_fileM = 0x3ff0000000000000;
            chrono::ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&fileM,&mca);
            if (1 < local_6c0) {
              *(Index *)(_fileM + 8) = 0x4000000000000000;
              chrono::ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&fileM,&mca);
              if (2 < local_6c0) {
                *(Index *)(_fileM + 0x10) = -0x4010000000000000;
                chrono::ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&fileM,&mca);
                if (0 < local_6c0) {
                  *(undefined8 *)_fileM = 0x3ff0000000000000;
                  chrono::ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&fileM,&mca);
                  if (1 < local_6c0) {
                    *(Index *)(_fileM + 8) = -0x4000000000000000;
                    chrono::ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&fileM,&mca);
                    if (2 < local_6c0) {
                      *(Index *)(_fileM + 0x10) = 0;
                      chrono::ChConstraintTwoGeneric::ChConstraintTwoGeneric
                                (&mcb,(ChVariables *)&mvarA,(ChVariables *)&mvarB);
                      chrono::ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&fileM,&mcb);
                      if (0 < local_6c0) {
                        *(undefined8 *)_fileM = 0;
                        chrono::ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&fileM,&mcb);
                        if (1 < local_6c0) {
                          *(Index *)(_fileM + 8) = 0x3ff0000000000000;
                          chrono::ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&fileM,&mcb);
                          if (2 < local_6c0) {
                            *(Index *)(_fileM + 0x10) = 0;
                            chrono::ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&fileM,&mcb);
                            if (0 < local_6c0) {
                              *(undefined8 *)_fileM = 0;
                              chrono::ChConstraintTwoGeneric::Get_Cq_b
                                        ((ChRowVectorRef *)&fileM,&mcb);
                              if (1 < local_6c0) {
                                *(Index *)(_fileM + 8) = -0x4000000000000000;
                                chrono::ChConstraintTwoGeneric::Get_Cq_b
                                          ((ChRowVectorRef *)&fileM,&mcb);
                                if (2 < local_6c0) {
                                  *(Index *)(_fileM + 0x10) = 0;
                                  chrono::ChSystemDescriptor::InsertConstraint
                                            (&mdescriptor,(ChConstraint *)&mca);
                                  chrono::ChSystemDescriptor::InsertConstraint
                                            (&mdescriptor,(ChConstraint *)&mcb);
                                  (**(code **)(_mdescriptor + 0x48))();
                                  chrono::ChSolverPSOR::ChSolverPSOR(&solver);
                                  chrono::ChIterativeSolverVI::SetOmega(0.8);
                                  chrono::ChSolverPSOR::Solve((ChSystemDescriptor *)&solver);
                                  chrono::ChSystemDescriptor::ComputeFeasabilityViolation
                                            ((double *)&mdescriptor,&max_res);
                                  matrM.
                                  super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
                                  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.
                                  m_isRValue = (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>
                                                )false;
                                  matrM._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_001355e8;
                                  matrM.m_outerSize = -1;
                                  matrM.m_innerSize = 0;
                                  matrM.m_outerIndex = (StorageIndex *)0x0;
                                  matrM.m_innerNonZeros = (StorageIndex *)0x0;
                                  matrM.m_data.m_values = (Scalar *)0x0;
                                  matrM.m_data.m_indices = (StorageIndex *)0x0;
                                  matrM.m_data.m_size = 0;
                                  matrM.m_data.m_allocatedSize = 0;
                                  Eigen::SparseMatrix<double,_1,_int>::resize(&matrM,0,0);
                                  matrCq.
                                  super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
                                  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.
                                  m_isRValue = (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>
                                                )false;
                                  matrCq._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_001355e8
                                  ;
                                  matrCq.m_outerSize = -1;
                                  matrCq.m_innerSize = 0;
                                  matrCq.m_outerIndex = (StorageIndex *)0x0;
                                  matrCq.m_innerNonZeros = (StorageIndex *)0x0;
                                  matrCq.m_data.m_values = (Scalar *)0x0;
                                  matrCq.m_data.m_indices = (StorageIndex *)0x0;
                                  matrCq.m_data.m_size = 0;
                                  matrCq.m_data.m_allocatedSize = 0;
                                  Eigen::SparseMatrix<double,_1,_int>::resize(&matrCq,0,0);
                                  chrono::ChSystemDescriptor::ConvertToMatrixForm
                                            ((SparseMatrix *)&mdescriptor,(SparseMatrix *)&matrCq,
                                             (SparseMatrix *)&matrM,(Matrix *)0x0,(Matrix *)0x0,
                                             (Matrix *)0x0,false,false);
                                  pcVar3 = (out_dir->_M_dataplus)._M_p;
                                  filename._M_dataplus._M_p = (pointer)&filename.field_2;
                                  std::__cxx11::string::_M_construct<char*>
                                            ((string *)&filename,pcVar3,
                                             pcVar3 + out_dir->_M_string_length);
                                  std::__cxx11::string::append((char *)&filename);
                                  chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile
                                            (&fileM,filename._M_dataplus._M_p,_S_trunc);
                                  pcVar3 = (out_dir->_M_dataplus)._M_p;
                                  _fileCq = local_310;
                                  std::__cxx11::string::_M_construct<char*>
                                            ((string *)&fileCq,pcVar3,
                                             pcVar3 + out_dir->_M_string_length);
                                  std::__cxx11::string::append((char *)&fileCq);
                                  std::__cxx11::string::operator=
                                            ((string *)&filename,(string *)&fileCq);
                                  if (_fileCq != local_310) {
                                    operator_delete(_fileCq,local_310[0] + 1);
                                  }
                                  chrono::ChStreamOutAsciiFile::ChStreamOutAsciiFile
                                            (&fileCq,filename._M_dataplus._M_p,_S_trunc);
                                  chrono::StreamOUTsparseMatlabFormat(&matrM,local_400);
                                  chrono::StreamOUTsparseMatlabFormat(&matrCq,local_50);
                                  chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&fileCq);
                                  chrono::ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&fileM);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)filename._M_dataplus._M_p != &filename.field_2) {
                                    operator_delete(filename._M_dataplus._M_p,
                                                    filename.field_2._M_allocated_capacity + 1);
                                  }
                                  pCVar14 = (ChStreamOutAscii *)chrono::GetLog();
                                  chrono::StreamOUT(&matrM,pCVar14);
                                  pCVar14 = (ChStreamOutAscii *)chrono::GetLog();
                                  chrono::StreamOUT(&matrCq,pCVar14);
                                  pCVar14 = (ChStreamOutAscii *)chrono::GetLog();
                                  chrono::ChStreamOutAscii::operator<<
                                            (pCVar14,"**** Using ChSolverPSOR  ********** \n\n");
                                  pCVar14 = (ChStreamOutAscii *)chrono::GetLog();
                                  pCVar14 = (ChStreamOutAscii *)
                                            chrono::ChStreamOutAscii::operator<<
                                                      (pCVar14,"METRICS: max residual: ");
                                  pCVar14 = (ChStreamOutAscii *)
                                            chrono::ChStreamOutAscii::operator<<(pCVar14,max_res);
                                  pCVar14 = (ChStreamOutAscii *)
                                            chrono::ChStreamOutAscii::operator<<
                                                      (pCVar14,"  max LCP error: ");
                                  pCVar14 = (ChStreamOutAscii *)
                                            chrono::ChStreamOutAscii::operator<<(pCVar14,max_LCPerr)
                                  ;
                                  chrono::ChStreamOutAscii::operator<<(pCVar14,"  \n\n");
                                  pCVar14 = (ChStreamOutAscii *)chrono::GetLog();
                                  chrono::ChStreamOutAscii::operator<<
                                            (pCVar14,"vars q_a and q_b -------------------\n");
                                  pCVar14 = (ChStreamOutAscii *)chrono::GetLog();
                                  chrono::ChVariables::Get_qb
                                            ((ChVectorRef *)&fileM,(ChVariables *)&mvarA);
                                  chrono::operator<<(pCVar14,(
                                                  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>
                                                  *)&fileM);
                                  pCVar14 = (ChStreamOutAscii *)chrono::GetLog();
                                  chrono::ChVariables::Get_qb
                                            ((ChVectorRef *)&fileM,(ChVariables *)&mvarB);
                                  pCVar14 = chrono::operator<<(pCVar14,(
                                                  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>
                                                  *)&fileM);
                                  chrono::ChStreamOutAscii::operator<<(pCVar14,"  \n");
                                  pCVar14 = (ChStreamOutAscii *)chrono::GetLog();
                                  chrono::ChStreamOutAscii::operator<<
                                            (pCVar14,"multipliers l_1 and l_2 ------------\n\n");
                                  pCVar14 = (ChStreamOutAscii *)chrono::GetLog();
                                  pCVar14 = (ChStreamOutAscii *)
                                            chrono::ChStreamOutAscii::operator<<(pCVar14,local_758);
                                  chrono::ChStreamOutAscii::operator<<(pCVar14," \n");
                                  pCVar14 = (ChStreamOutAscii *)chrono::GetLog();
                                  pCVar14 = (ChStreamOutAscii *)
                                            chrono::ChStreamOutAscii::operator<<(pCVar14,local_7f0);
                                  chrono::ChStreamOutAscii::operator<<(pCVar14," \n\n");
                                  pCVar14 = (ChStreamOutAscii *)chrono::GetLog();
                                  chrono::ChStreamOutAscii::operator<<
                                            (pCVar14,"constraint residuals c_1 and c_2 ---\n");
                                  pCVar14 = (ChStreamOutAscii *)chrono::GetLog();
                                  pCVar14 = (ChStreamOutAscii *)
                                            chrono::ChStreamOutAscii::operator<<(pCVar14,local_760);
                                  chrono::ChStreamOutAscii::operator<<(pCVar14,"  \n");
                                  pCVar14 = (ChStreamOutAscii *)chrono::GetLog();
                                  pCVar14 = (ChStreamOutAscii *)
                                            chrono::ChStreamOutAscii::operator<<(pCVar14,local_7f8);
                                  chrono::ChStreamOutAscii::operator<<(pCVar14,"  \n\n\n");
                                  chrono::ChVariables::Get_qb
                                            ((ChVectorRef *)&fileM,(ChVariables *)&mvarA);
                                  vVar13.m_value = _fileM;
                                  if (-1 < IVar12) {
                                    pMVar21 = (Matrix<double,__1,__1,_1,__1,__1> *)IVar12;
                                    if (((_fileM & 7U) == 0) &&
                                       (pMVar21 = (Matrix<double,__1,__1,_1,__1,__1> *)
                                                  (ulong)(-((uint)((ulong)_fileM >> 3) & 0x1fffffff)
                                                         & 7), (ulong)IVar12 <= pMVar21)) {
                                      pMVar21 = (Matrix<double,__1,__1,_1,__1,__1> *)IVar12;
                                    }
                                    uVar15 = IVar12 - (long)pMVar21;
                                    uVar18 = uVar15 + 7;
                                    if (-1 < (long)uVar15) {
                                      uVar18 = uVar15;
                                    }
                                    if (pMVar21 != (Matrix<double,__1,__1,_1,__1,__1> *)0x0) {
                                      memset((void *)_fileM,0,(long)pMVar21 * 8);
                                    }
                                    pIVar2 = (Index *)((long)&(pMVar21->
                                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data + (uVar18 & 0xfffffffffffffff8)
                                                  );
                                    if (7 < (long)uVar15) {
                                      pIVar19 = &(pMVar21->
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                 ).m_storage.m_rows;
                                      if ((long)pIVar19 < (long)pIVar2) {
                                        pIVar19 = pIVar2;
                                      }
                                      memset((undefined8 *)(vVar13.m_value + (long)pMVar21 * 8),0,
                                             (~(ulong)pMVar21 + (long)pIVar19 & 0xfffffffffffffff8)
                                             * 8 + 0x40);
                                    }
                                    if ((long)pIVar2 < IVar12) {
                                      memset((undefined8 *)
                                             (vVar13.m_value + ((long)uVar18 >> 3) * 0x40) +
                                             (long)pMVar21,0,((long)uVar15 % 8) * 8);
                                    }
                                    chrono::ChVariables::Get_qb
                                              ((ChVectorRef *)&fileM,(ChVariables *)&mvarB);
                                    vVar13.m_value = _fileM;
                                    if (-1 < IVar12) {
                                      pMVar21 = (Matrix<double,__1,__1,_1,__1,__1> *)IVar12;
                                      if (((_fileM & 7U) == 0) &&
                                         (pMVar21 = (Matrix<double,__1,__1,_1,__1,__1> *)
                                                    (ulong)(-((uint)((ulong)_fileM >> 3) &
                                                             0x1fffffff) & 7),
                                         (ulong)IVar12 <= pMVar21)) {
                                        pMVar21 = (Matrix<double,__1,__1,_1,__1,__1> *)IVar12;
                                      }
                                      uVar15 = IVar12 - (long)pMVar21;
                                      uVar18 = uVar15 + 7;
                                      if (-1 < (long)uVar15) {
                                        uVar18 = uVar15;
                                      }
                                      if (pMVar21 != (Matrix<double,__1,__1,_1,__1,__1> *)0x0) {
                                        memset((void *)_fileM,0,(long)pMVar21 * 8);
                                      }
                                      pIVar2 = (Index *)((long)&(pMVar21->
                                                                                                                                
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_data + (uVar18 & 0xfffffffffffffff8)
                                                  );
                                      if (7 < (long)uVar15) {
                                        pIVar19 = &(pMVar21->
                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                  ).m_storage.m_rows;
                                        if ((long)pIVar19 < (long)pIVar2) {
                                          pIVar19 = pIVar2;
                                        }
                                        memset((undefined8 *)(vVar13.m_value + (long)pMVar21 * 8),0,
                                               (~(ulong)pMVar21 + (long)pIVar19 & 0xfffffffffffffff8
                                               ) * 8 + 0x40);
                                      }
                                      if ((long)pIVar2 < IVar12) {
                                        memset((undefined8 *)
                                               (vVar13.m_value + ((long)uVar18 >> 3) * 0x40) +
                                               (long)pMVar21,0,((long)uVar15 % 8) * 8);
                                      }
                                      matrCq._vptr_SparseMatrix =
                                           (_func_int **)&PTR_SetElement_001355e8;
                                      free(matrCq.m_outerIndex);
                                      free(matrCq.m_innerNonZeros);
                                      Eigen::internal::CompressedStorage<double,_int>::
                                      ~CompressedStorage(&matrCq.m_data);
                                      matrM._vptr_SparseMatrix =
                                           (_func_int **)&PTR_SetElement_001355e8;
                                      free(matrM.m_outerIndex);
                                      free(matrM.m_innerNonZeros);
                                      Eigen::internal::CompressedStorage<double,_int>::
                                      ~CompressedStorage(&matrM.m_data);
                                      chrono::ChIterativeSolverVI::~ChIterativeSolverVI
                                                ((ChIterativeSolverVI *)&solver);
                                      chrono::ChConstraintTwoGeneric::~ChConstraintTwoGeneric(&mcb);
                                      chrono::ChConstraintTwoGeneric::~ChConstraintTwoGeneric(&mca);
                                      chrono::ChVariablesGeneric::~ChVariablesGeneric(&mvarB);
                                      chrono::ChVariablesGeneric::~ChVariablesGeneric(&mvarA);
                                      chrono::ChSystemDescriptor::~ChSystemDescriptor(&mdescriptor);
                                      return;
                                    }
                                  }
                                  pcVar17 = 
                                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                                  ;
                                  goto LAB_0010f599;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          pcVar17 = 
          "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, 1, -1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, 1, -1>>, Level = 1]"
          ;
          goto LAB_0010f578;
        }
        goto LAB_0010f514;
      }
    }
    pcVar17 = 
    "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
    ;
LAB_0010f578:
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,pcVar17);
  }
LAB_0010f514:
  pcVar17 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
  ;
LAB_0010f599:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar17);
}

Assistant:

void test_1(const std::string& out_dir) {
    GetLog() << "\n-------------------------------------------------\n";
    GetLog() << "TEST: generic system with two constraints \n\n";

    // Important: create a 'system descriptor' object that
    // contains variables and constraints:

    ChSystemDescriptor mdescriptor;

    // Now let's add variables and constraints, as sparse data:

    mdescriptor.BeginInsertion();  // ----- system description starts here

    // create C++ objects representing 'variables':

    ChVariablesGeneric mvarA(3);
    mvarA.GetMass().setIdentity();
    mvarA.GetMass() *= 10;
    mvarA.GetInvMass() = mvarA.GetMass().inverse();
    mvarA.Get_fb()(0) = 1;
    mvarA.Get_fb()(1) = 2;

    ChVariablesGeneric mvarB(3);
    mvarB.GetMass().setIdentity();
    mvarB.GetMass() *= 20;
    mvarB.GetInvMass() = mvarB.GetMass().inverse();

    mdescriptor.InsertVariables(&mvarA);
    mdescriptor.InsertVariables(&mvarB);

    // create C++ objects representing 'constraints' between variables:

    ChConstraintTwoGeneric mca(&mvarA, &mvarB);
    mca.Set_b_i(-5);
    mca.Get_Cq_a()(0) = 1;
    mca.Get_Cq_a()(1) = 2;
    mca.Get_Cq_a()(2) = -1;
    mca.Get_Cq_b()(0) = 1;
    mca.Get_Cq_b()(1) = -2;
    mca.Get_Cq_b()(2) = 0;

    ChConstraintTwoGeneric mcb(&mvarA, &mvarB);
    mcb.Set_b_i(1);
    mcb.Get_Cq_a()(0) = 0;
    mcb.Get_Cq_a()(1) = 1;
    mcb.Get_Cq_a()(2) = 0;
    mcb.Get_Cq_b()(0) = 0;
    mcb.Get_Cq_b()(1) = -2;
    mcb.Get_Cq_b()(2) = 0;

    mdescriptor.InsertConstraint(&mca);
    mdescriptor.InsertConstraint(&mcb);

    mdescriptor.EndInsertion();  // ----- system description ends here

    // Solve the problem with an iterative fixed-point solver, for an
    // approximate (but very fast) solution:
    
    // Create the solver...
    ChSolverPSOR solver;
    solver.SetMaxIterations(1);
    solver.EnableWarmStart(false);
    solver.SetTolerance(0.0);
    solver.SetOmega(0.8);

    // .. pass the constraint and the variables to the solver to solve
    solver.Setup(mdescriptor);
    solver.Solve(mdescriptor);

    // Ok, now present the result to the user, with some
    // statistical information:
    double max_res, max_LCPerr;
    mdescriptor.ComputeFeasabilityViolation(max_res, max_LCPerr);

    // If needed, dump the full system M and Cq matrices
    // on disk, in Matlab sparse format:
    ChSparseMatrix matrM;
    ChSparseMatrix matrCq;

    mdescriptor.ConvertToMatrixForm(&matrCq, &matrM, 0, 0, 0, 0, false, false);

    try {
        std::string filename = out_dir + "/dump_M_1.dat";
        ChStreamOutAsciiFile fileM(filename.c_str());
        filename = out_dir + "/dump_Cq_1.dat";
        ChStreamOutAsciiFile fileCq(filename.c_str());
        StreamOUTsparseMatlabFormat(matrM, fileM);
        StreamOUTsparseMatlabFormat(matrCq, fileCq);
    } catch (const ChException &myex) {
        GetLog() << "FILE ERROR: " << myex.what();
    }

    StreamOUT(matrM, GetLog());
    StreamOUT(matrCq, GetLog());

    GetLog() << "**** Using ChSolverPSOR  ********** \n\n";
    GetLog() << "METRICS: max residual: " << max_res << "  max LCP error: " << max_LCPerr << "  \n\n";
    GetLog() << "vars q_a and q_b -------------------\n";
    GetLog() << mvarA.Get_qb();
    GetLog() << mvarB.Get_qb() << "  \n";
    GetLog() << "multipliers l_1 and l_2 ------------\n\n";
    GetLog() << mca.Get_l_i() << " \n";
    GetLog() << mcb.Get_l_i() << " \n\n";
    GetLog() << "constraint residuals c_1 and c_2 ---\n";
    GetLog() << mca.Get_c_i() << "  \n";
    GetLog() << mcb.Get_c_i() << "  \n\n\n";

    // reset variables
    mvarA.Get_qb().setZero();
    mvarB.Get_qb().setZero();
}